

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

void __thiscall google::protobuf::internal::Mutex::Unlock(Mutex *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int __errnum;
  LogMessage local_50;
  
  __errnum = pthread_mutex_unlock((pthread_mutex_t *)this->mInternal);
  if (__errnum != 0) {
    local_50.level_ = LOGLEVEL_DFATAL;
    local_50.filename_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/common.cc"
    ;
    local_50.line_ = 0x137;
    paVar1 = &local_50.message_.field_2;
    local_50.message_._M_string_length = 0;
    local_50.message_.field_2._M_local_buf[0] = '\0';
    local_50.message_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::append((char *)&local_50.message_);
    strerror(__errnum);
    std::__cxx11::string::append((char *)&local_50.message_);
    LogMessage::Finish(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.message_._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.message_._M_dataplus._M_p,
                      CONCAT71(local_50.message_.field_2._M_allocated_capacity._1_7_,
                               local_50.message_.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void Mutex::Unlock() {
  int result = pthread_mutex_unlock(&mInternal->mutex);
  if (result != 0) {
    GOOGLE_LOG(FATAL) << "pthread_mutex_unlock: " << strerror(result);
  }
}